

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

server_extension * server_extension_detect(xcb_connection_t *connection)

{
  _Bool _Var1;
  long lVar2;
  xcb_query_extension_reply_t *cache;
  server_extension *extension;
  xcb_connection_t *connection_local;
  
  connection_local = (xcb_connection_t *)malloc(0x10);
  if (connection_local == (xcb_connection_t *)0x0) {
    connection_local = (xcb_connection_t *)0x0;
  }
  else {
    lVar2 = xcb_get_extension_data(connection,&xcb_randr_id);
    if ((lVar2 == 0) || (*(char *)(lVar2 + 8) == '\0')) {
      lVar2 = xcb_get_extension_data(connection,&xcb_xinerama_id);
      if ((lVar2 == 0) ||
         ((*(char *)(lVar2 + 8) == '\0' || (_Var1 = xinerama_is_active(connection), !_Var1)))) {
        *(undefined4 *)connection_local = 2;
        *(undefined8 *)(connection_local + 8) = 0;
      }
      else {
        *(undefined4 *)connection_local = 1;
        *(long *)(connection_local + 8) = lVar2;
      }
    }
    else {
      *(undefined4 *)connection_local = 0;
      *(long *)(connection_local + 8) = lVar2;
    }
  }
  return (server_extension *)connection_local;
}

Assistant:

struct server_extension *server_extension_detect(xcb_connection_t *connection)
{
        struct server_extension *extension = malloc(sizeof(struct server_extension));

        if (extension == NULL) {
                return NULL;
        }

        const xcb_query_extension_reply_t *cache = XCB_NONE;

        cache = xcb_get_extension_data(connection, &xcb_randr_id);

        if (cache && cache->present) {
                extension->type = RANDR;
                extension->data_cache = cache;

                return extension;
        }

        cache = xcb_get_extension_data(connection, &xcb_xinerama_id);

        if ((cache && cache->present) && xinerama_is_active(connection)) {
                extension->type = XINERAMA;
                extension->data_cache = cache;

                return extension;
        }

        extension->type = NO_EXTENSION;
        extension->data_cache = NULL;

        return extension;
}